

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStream * Catch::makeStream(StringRef *filename)

{
  long lVar1;
  bool bVar2;
  char cVar3;
  StringRef *in_RDI;
  long in_FS_OFFSET;
  ReusableStringStream *in_stack_ffffffffffffff28;
  ReusableStringStream *in_stack_ffffffffffffff30;
  StringRef *in_stack_ffffffffffffff38;
  StringRef *in_stack_ffffffffffffff40;
  DebugOutStream *in_stack_ffffffffffffff50;
  string *msg;
  ReusableStringStream *in_stack_ffffffffffffff60;
  FileStream *in_stack_ffffffffffffff98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  in_stack_ffffffffffffffa0;
  IStream *local_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = StringRef::empty(in_RDI);
  if (bVar2) {
    local_30 = (IStream *)operator_new(0x118);
    Detail::anon_unknown_0::CoutStream::CoutStream((CoutStream *)in_stack_ffffffffffffff50);
  }
  else {
    cVar3 = StringRef::operator[]
                      ((StringRef *)in_stack_ffffffffffffff30,(size_type)in_stack_ffffffffffffff28);
    if (cVar3 == '%') {
      StringRef::StringRef(in_stack_ffffffffffffff40,(char *)in_stack_ffffffffffffff38);
      bVar2 = StringRef::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if (!bVar2) {
        msg = (string *)&stack0xffffffffffffff90;
        ReusableStringStream::ReusableStringStream(in_stack_ffffffffffffff60);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff30,(char (*) [23])in_stack_ffffffffffffff28);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff30,(StringRef *)in_stack_ffffffffffffff28);
        ReusableStringStream::operator<<
                  (in_stack_ffffffffffffff30,(char (*) [2])in_stack_ffffffffffffff28);
        ReusableStringStream::str_abi_cxx11_(in_stack_ffffffffffffff28);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          throw_domain_error(msg);
        }
        goto LAB_00233966;
      }
      local_30 = (IStream *)operator_new(0x120);
      Detail::anon_unknown_0::DebugOutStream::DebugOutStream(in_stack_ffffffffffffff50);
    }
    else {
      local_30 = (IStream *)operator_new(0x208);
      Detail::anon_unknown_0::FileStream::FileStream
                (in_stack_ffffffffffffff98,(StringRef)in_stack_ffffffffffffffa0);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_30;
  }
LAB_00233966:
  __stack_chk_fail();
}

Assistant:

auto makeStream( StringRef const &filename ) -> IStream const* {
        if( filename.empty() )
            return new Detail::CoutStream();
        else if( filename[0] == '%' ) {
            if( filename == "%debug" )
                return new Detail::DebugOutStream();
            else
                CATCH_ERROR( "Unrecognised stream: '" << filename << "'" );
        }
        else
            return new Detail::FileStream( filename );
    }